

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O1

void basist::decoder_etc_block::get_block_colors5
               (color32 *pBlock_colors,color32 *base_color5,uint32_t inten_table)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  bVar8 = (base_color5->field_0).field_0.r;
  bVar1 = (base_color5->field_0).field_0.g;
  bVar2 = (base_color5->field_0).field_0.b;
  uVar11 = (ulong)inten_table;
  uVar4 = (uint)(byte)(bVar8 >> 2 | bVar8 * '\b');
  iVar3 = (&g_etc1_inten_tables)[uVar11 * 4];
  uVar5 = iVar3 + uVar4;
  if (0xff < uVar5) {
    if ((int)uVar5 < 0) {
      uVar5 = 0;
    }
    else if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
  }
  bVar8 = bVar2 * '\b' | bVar2 >> 2;
  uVar6 = (uint)(byte)(bVar1 >> 2 | bVar1 * '\b');
  uVar7 = iVar3 + uVar6;
  if (0xff < uVar7) {
    if ((int)uVar7 < 0) {
      uVar7 = 0;
    }
    else if (0xfe < (int)uVar7) {
      uVar7 = 0xff;
    }
  }
  uVar9 = iVar3 + (uint)bVar8;
  uVar10 = uVar9;
  if (0xff < uVar9) {
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0xff;
      if ((int)uVar9 < 0xff) {
        uVar10 = uVar9;
      }
    }
  }
  (pBlock_colors->field_0).field_0.r = (uint8_t)uVar5;
  (pBlock_colors->field_0).field_0.g = (uint8_t)uVar7;
  (pBlock_colors->field_0).field_0.b = (uint8_t)uVar10;
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar3 = (&DAT_0027fa84)[uVar11 * 4];
  uVar5 = iVar3 + uVar4;
  if (0xff < uVar5) {
    if ((int)uVar5 < 0) {
      uVar5 = 0;
    }
    else if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
  }
  uVar7 = iVar3 + uVar6;
  if (0xff < uVar7) {
    if ((int)uVar7 < 0) {
      uVar7 = 0;
    }
    else if (0xfe < (int)uVar7) {
      uVar7 = 0xff;
    }
  }
  uVar9 = iVar3 + (uint)bVar8;
  uVar10 = uVar9;
  if (0xff < uVar9) {
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0xff;
      if ((int)uVar9 < 0xff) {
        uVar10 = uVar9;
      }
    }
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)uVar5;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)uVar7;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)uVar10;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  iVar3 = (&DAT_0027fa88)[uVar11 * 4];
  uVar5 = iVar3 + uVar4;
  if (0xff < uVar5) {
    if ((int)uVar5 < 0) {
      uVar5 = 0;
    }
    else if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
  }
  uVar7 = iVar3 + uVar6;
  if (0xff < uVar7) {
    if ((int)uVar7 < 0) {
      uVar7 = 0;
    }
    else if (0xfe < (int)uVar7) {
      uVar7 = 0xff;
    }
  }
  uVar9 = iVar3 + (uint)bVar8;
  uVar10 = uVar9;
  if (0xff < uVar9) {
    if ((int)uVar9 < 0) {
      uVar10 = 0;
    }
    else {
      uVar10 = 0xff;
      if ((int)uVar9 < 0xff) {
        uVar10 = uVar9;
      }
    }
  }
  pBlock_colors[2].field_0.field_0.r = (uint8_t)uVar5;
  pBlock_colors[2].field_0.field_0.g = (uint8_t)uVar7;
  pBlock_colors[2].field_0.field_0.b = (uint8_t)uVar10;
  pBlock_colors[2].field_0.field_0.a = 0xff;
  iVar3 = (&DAT_0027fa8c)[uVar11 * 4];
  uVar4 = uVar4 + iVar3;
  uVar5 = uVar4;
  if (0xff < uVar4) {
    if ((int)uVar4 < 0) {
      uVar5 = 0;
    }
    else {
      uVar5 = 0xff;
      if ((int)uVar4 < 0xff) {
        uVar5 = uVar4;
      }
    }
  }
  uVar6 = uVar6 + iVar3;
  uVar4 = uVar6;
  if (0xff < uVar6) {
    if ((int)uVar6 < 0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0xff;
      if ((int)uVar6 < 0xff) {
        uVar4 = uVar6;
      }
    }
  }
  uVar7 = iVar3 + (uint)bVar8;
  if (0xff < uVar7) {
    if ((int)uVar7 < 0) {
      uVar7 = 0;
    }
    else if (0xfe < (int)uVar7) {
      uVar7 = 0xff;
    }
  }
  pBlock_colors[3].field_0.field_0.r = (uint8_t)uVar5;
  pBlock_colors[3].field_0.field_0.g = (uint8_t)uVar4;
  pBlock_colors[3].field_0.field_0.b = (uint8_t)uVar7;
  pBlock_colors[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

static void get_block_colors5(color32* pBlock_colors, const color32& base_color5, uint32_t inten_table)
		{
			color32 b(base_color5);

			b.r = (b.r << 3) | (b.r >> 2);
			b.g = (b.g << 3) | (b.g >> 2);
			b.b = (b.b << 3) | (b.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			pBlock_colors[0].set(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}